

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O0

void * mi_heap_realloc_zero_aligned_at
                 (mi_heap_t *heap,void *p,size_t newsize,size_t alignment,size_t offset,_Bool zero)

{
  byte bVar1;
  size_t sVar2;
  mi_heap_t *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_R8;
  byte in_R9B;
  size_t start;
  void *newp;
  size_t size;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  mi_heap_t *in_stack_ffffffffffffffa0;
  void *local_58;
  void *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  void *local_8;
  
  bVar1 = in_R9B & 1;
  if (in_RCX < (mi_heap_t *)0x9) {
    local_8 = _mi_heap_realloc_zero
                        (in_RCX,in_R8,CONCAT17(in_R9B,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff
                         ,SUB81(in_stack_ffffffffffffffc0 >> 0x38,0));
  }
  else if (in_RSI == (void *)0x0) {
    local_8 = mi_heap_malloc_zero_aligned_at
                        (in_RCX,(size_t)in_R8,
                         CONCAT17(in_R9B,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff,
                         in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0)
                        );
  }
  else {
    sVar2 = mi_usable_size((void *)0x453514);
    if ((((sVar2 < in_RDX) || (in_RDX < sVar2 - (sVar2 >> 1))) ||
        (local_8 = in_RSI, (ulong)((long)in_RSI + (long)in_R8) % (ulong)in_RCX != 0)) &&
       (local_8 = mi_heap_malloc_aligned_at
                            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                             (size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88),
       local_8 != (void *)0x0)) {
      if (((bVar1 & 1) != 0) && (sVar2 < in_RDX)) {
        if (sVar2 < 8) {
          local_58 = (void *)0x0;
        }
        else {
          local_58 = (void *)(sVar2 - 8);
        }
        _mi_memzero(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffffb0 = local_58;
      }
      if (sVar2 < in_RDX) {
        in_RDX = sVar2;
      }
      _mi_memcpy_aligned(in_RSI,local_8,in_RDX);
      mi_free(in_stack_ffffffffffffffb0);
    }
  }
  return local_8;
}

Assistant:

static void* mi_heap_realloc_zero_aligned_at(mi_heap_t* heap, void* p, size_t newsize, size_t alignment, size_t offset, bool zero) mi_attr_noexcept {
  mi_assert(alignment > 0);
  if (alignment <= sizeof(uintptr_t)) return _mi_heap_realloc_zero(heap,p,newsize,zero);
  if (p == NULL) return mi_heap_malloc_zero_aligned_at(heap,newsize,alignment,offset,zero);
  size_t size = mi_usable_size(p);
  if (newsize <= size && newsize >= (size - (size / 2))
      && (((uintptr_t)p + offset) % alignment) == 0) {
    return p;  // reallocation still fits, is aligned and not more than 50% waste
  }
  else {
    // note: we don't zero allocate upfront so we only zero initialize the expanded part
    void* newp = mi_heap_malloc_aligned_at(heap,newsize,alignment,offset);
    if (newp != NULL) {
      if (zero && newsize > size) {
        // also set last word in the previous allocation to zero to ensure any padding is zero-initialized
        size_t start = (size >= sizeof(intptr_t) ? size - sizeof(intptr_t) : 0);
        _mi_memzero((uint8_t*)newp + start, newsize - start);
      }
      _mi_memcpy_aligned(newp, p, (newsize > size ? size : newsize));
      mi_free(p); // only free if successful
    }
    return newp;
  }
}